

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * ad(tensor *a,tensor *b)

{
  undefined8 *puVar1;
  tensor *ptVar2;
  initializer_list<tensor_*> __l;
  allocator_type local_41;
  vector<tensor_*,_std::allocator<tensor_*>_> local_40;
  tensor *local_28;
  tensor *local_20;
  
  puVar1 = (undefined8 *)operator_new(0x48);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  *puVar1 = &PTR_forward_0010a988;
  *(undefined1 *)(puVar1 + 8) = 0;
  node::node_cnt = node::node_cnt + 1;
  *puVar1 = &PTR_forward_0010a928;
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_28 = a;
  local_20 = b;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_40,__l,&local_41);
  ptVar2 = (tensor *)(**(code **)*puVar1)(puVar1,&local_40);
  if (local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ptVar2;
}

Assistant:

tensor* ad(tensor *a, tensor *b){
    node *op=new add();
    return op->forward({a,b});
}